

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

void __thiscall google::protobuf::io::Tokenizer::NextChar(Tokenizer *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  if (this->current_char_ == '\t') {
    uVar1 = this->column_;
    uVar4 = uVar1 + 7;
    if (-1 < (int)uVar1) {
      uVar4 = uVar1;
    }
    this->column_ = (uVar4 & 0xfffffff8) + 8;
  }
  else if (this->current_char_ == '\n') {
    this->line_ = this->line_ + 1;
    this->column_ = 0;
  }
  else {
    this->column_ = this->column_ + 1;
  }
  lVar3 = (long)this->buffer_pos_ + 1;
  iVar2 = (int)lVar3;
  this->buffer_pos_ = iVar2;
  if (iVar2 < this->buffer_size_) {
    this->current_char_ = this->buffer_[lVar3];
    return;
  }
  Refresh(this);
  return;
}

Assistant:

void Tokenizer::NextChar() {
  // Update our line and column counters based on the character being
  // consumed.
  if (current_char_ == '\n') {
    ++line_;
    column_ = 0;
  } else if (current_char_ == '\t') {
    column_ += kTabWidth - column_ % kTabWidth;
  } else {
    ++column_;
  }

  // Advance to the next character.
  ++buffer_pos_;
  if (buffer_pos_ < buffer_size_) {
    current_char_ = buffer_[buffer_pos_];
  } else {
    Refresh();
  }
}